

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O3

void HN::parseStory(ItemData *data,Story *res)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pcVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  int *piVar7;
  long lVar8;
  uint64_t uVar9;
  undefined8 uVar10;
  int iVar11;
  size_type sVar12;
  key_type local_b8;
  key_type local_98;
  string local_70;
  string local_50;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"by","");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::at(data,&local_b8);
  std::__cxx11::string::_M_assign((string *)res);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"descendants","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(data,&local_b8);
  piVar2 = (pointer)(pmVar6->_M_dataplus)._M_p;
  piVar7 = __errno_location();
  iVar11 = *piVar7;
  *piVar7 = 0;
  lVar8 = strtol((char *)piVar2,(char **)&local_98,10);
  if ((pointer)local_98._M_dataplus._M_p == piVar2) {
    std::__throw_invalid_argument("stoi");
LAB_0010bc3d:
    std::__throw_invalid_argument("stoi");
LAB_0010bc49:
    std::__throw_invalid_argument("stoi");
LAB_0010bc55:
    std::__throw_invalid_argument("stoll");
LAB_0010bc61:
    std::__throw_out_of_range("stoi");
  }
  else {
    if ((lVar8 - 0x80000000U < 0xffffffff00000000) || (*piVar7 == 0x22)) goto LAB_0010bc61;
    if (*piVar7 == 0) {
      *piVar7 = iVar11;
    }
    res->descendants = (int)lVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"id","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(data,&local_b8);
    piVar2 = (pointer)(pmVar6->_M_dataplus)._M_p;
    piVar7 = __errno_location();
    iVar11 = *piVar7;
    *piVar7 = 0;
    lVar8 = strtol((char *)piVar2,(char **)&local_98,10);
    if ((pointer)local_98._M_dataplus._M_p == piVar2) goto LAB_0010bc3d;
    if ((0xfffffffeffffffff < lVar8 - 0x80000000U) && (*piVar7 != 0x22)) {
      if (*piVar7 == 0) {
        *piVar7 = iVar11;
      }
      res->id = (ItemId)lVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"kids","");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::at(data,&local_b8);
      JSON::parseIntArray((vector<int,_std::allocator<int>_> *)&local_98,pmVar6);
      piVar2 = (res->kids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (res->kids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (res->kids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_98._M_dataplus._M_p;
      (res->kids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_98._M_string_length;
      (res->kids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)local_98.field_2._M_allocated_capacity;
      local_98._M_dataplus._M_p = (pointer)0x0;
      local_98._M_string_length = 0;
      local_98.field_2._M_allocated_capacity = 0;
      if ((piVar2 != (pointer)0x0) &&
         (operator_delete(piVar2,(long)piVar3 - (long)piVar2),
         (pointer)local_98._M_dataplus._M_p != (pointer)0x0)) {
        operator_delete(local_98._M_dataplus._M_p,
                        local_98.field_2._M_allocated_capacity - (long)local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"score","");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::at(data,&local_b8);
      piVar2 = (pointer)(pmVar6->_M_dataplus)._M_p;
      piVar7 = __errno_location();
      iVar11 = *piVar7;
      *piVar7 = 0;
      lVar8 = strtol((char *)piVar2,(char **)&local_98,10);
      if ((pointer)local_98._M_dataplus._M_p == piVar2) goto LAB_0010bc49;
      if ((lVar8 - 0x80000000U < 0xffffffff00000000) || (*piVar7 == 0x22)) goto LAB_0010bc79;
      if (*piVar7 == 0) {
        *piVar7 = iVar11;
      }
      res->score = (int)lVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"time","");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::at(data,&local_b8);
      piVar2 = (pointer)(pmVar6->_M_dataplus)._M_p;
      piVar7 = __errno_location();
      iVar11 = *piVar7;
      *piVar7 = 0;
      uVar9 = strtoll((char *)piVar2,(char **)&local_98,10);
      if ((pointer)local_98._M_dataplus._M_p != piVar2) {
        if (*piVar7 != 0) {
          if (*piVar7 != 0x22) goto LAB_0010b9ef;
          uVar9 = std::__throw_out_of_range("stoll");
        }
        *piVar7 = iVar11;
LAB_0010b9ef:
        res->time = uVar9;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        paVar1 = &local_98.field_2;
        local_98._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"text","");
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::at(data,&local_98);
        pcVar4 = (pmVar6->_M_dataplus)._M_p;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar4,pcVar4 + pmVar6->_M_string_length);
        parseHTML(&local_b8,&local_50);
        std::__cxx11::string::operator=((string *)&res->text,(string *)&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        local_98._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"title","");
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::at(data,&local_98);
        pcVar4 = (pmVar6->_M_dataplus)._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar4,pcVar4 + pmVar6->_M_string_length);
        parseHTML(&local_b8,&local_70);
        std::__cxx11::string::operator=((string *)&res->title,(string *)&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"url","");
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::at(data,&local_b8);
        std::__cxx11::string::_M_assign((string *)&res->url);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_replace
                  ((ulong)&res->domain,0,(char *)(res->domain)._M_string_length,0x165c05);
        sVar5 = (res->url)._M_string_length;
        if (sVar5 == 0) {
          return;
        }
        pcVar4 = (res->url)._M_dataplus._M_p;
        sVar12 = 0;
        iVar11 = 0;
        do {
          if (pcVar4[sVar12] == '/') {
            iVar11 = iVar11 + 1;
          }
          else {
            if (2 < iVar11) {
              return;
            }
            if (iVar11 == 2) {
              iVar11 = 2;
              std::__cxx11::string::push_back((char)&res->domain);
            }
          }
          sVar12 = sVar12 + 1;
        } while (sVar5 != sVar12);
        return;
      }
      goto LAB_0010bc55;
    }
  }
  std::__throw_out_of_range("stoi");
LAB_0010bc79:
  uVar10 = std::__throw_out_of_range("stoi");
  __cxa_begin_catch(uVar10);
  std::__cxx11::string::operator=((string *)&res->url,"");
  std::__cxx11::string::operator=((string *)&res->domain,"");
  __cxa_end_catch();
  return;
}

Assistant:

void parseStory(const ItemData & data, Story & res) {
        try {
            res.by = data.at("by");
        } catch (...) {
            res.by = "[deleted]";
        }
        try {
            res.descendants = std::stoi(data.at("descendants"));
        } catch (...) {
            res.descendants = 0;
        }
        try {
            res.id = std::stoi(data.at("id"));
        } catch (...) {
            res.id = 0;
        }
        try {
            res.kids = JSON::parseIntArray(data.at("kids"));
        } catch (...) {
            res.kids.clear();
        }
        try {
            res.score = std::stoi(data.at("score"));
        } catch (...) {
            res.score = 0;
        }
        try {
            res.time = std::stoll(data.at("time"));
        } catch (...) {
            res.time = 0;
        }
        try {
            res.text = parseHTML(data.at("text"));
        } catch (...) {
            res.text = "";
        }
        try {
            res.title = parseHTML(data.at("title"));
        } catch (...) {
            res.title = "";
        }
        try {
            res.url = data.at("url");
            res.domain = "";
            int slash = 0;
            for (auto & ch : res.url) {
                if (ch == '/') {
                    ++slash;
                    continue;
                }
                if (slash > 2) break;
                if (slash > 1) res.domain += ch;
            }
        } catch (...) {
            res.url = "";
            res.domain = "";
        }
    }